

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O2

void __thiscall
ktx::CommandExtract::saveEXR
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,int pixelType,char *data,
          size_t size)

{
  size_type __n;
  allocator_type local_69;
  _Vector_base<int,_std::allocator<int>_> local_68;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)filepath);
  __n = 3;
  if (vkFormat != VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
    __n = (size_type)(format->extended).channelCount;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_68,__n,&pixelType,&local_69);
  saveEXR(this,&local_50,appendExtension,vkFormat,format,width,height,
          (vector<int,_std::allocator<int>_> *)&local_68,data,size);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CommandExtract::saveEXR(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        int pixelType, const char* data, std::size_t size) {
    saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height,
            std::vector<int>(vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32 ? 3 : format.channelCount(), pixelType),
            data, size);
}